

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mfsSat.c
# Opt level: O2

int Abc_NtkAddOneHotness(Mfs_Man_t *p)

{
  int *piVar1;
  int iVar2;
  int iVar3;
  Aig_Obj_t *pAVar4;
  Aig_Obj_t *pAVar5;
  int i;
  int i_00;
  int Lits [2];
  
  iVar3 = p->pAigWin->vCis->nSize;
  iVar2 = 0;
  do {
    i = iVar2;
    if (iVar3 <= i) {
      return 1;
    }
    i_00 = i + 1;
    while( true ) {
      iVar3 = p->pAigWin->vCis->nSize;
      iVar2 = i + 1;
      if (iVar3 <= i_00) break;
      pAVar4 = Aig_ManCi(p->pAigWin,i);
      pAVar5 = Aig_ManCi(p->pAigWin,i_00);
      piVar1 = p->pCnf->pVarNums;
      Lits[0] = piVar1[pAVar4->Id] * 2 + 1;
      Lits[1] = piVar1[pAVar5->Id] * 2 + 1;
      iVar3 = sat_solver_addclause(p->pSat,Lits,(lit *)&stack0xffffffffffffffd0);
      i_00 = i_00 + 1;
      if (iVar3 == 0) {
        sat_solver_delete(p->pSat);
        p->pSat = (sat_solver *)0x0;
        return 0;
      }
    }
  } while( true );
}

Assistant:

int Abc_NtkAddOneHotness( Mfs_Man_t * p )
{
    Aig_Obj_t * pObj1, * pObj2;
    int i, k, Lits[2];
    for ( i = 0; i < Vec_PtrSize(p->pAigWin->vCis); i++ )
    for ( k = i+1; k < Vec_PtrSize(p->pAigWin->vCis); k++ )
    {
        pObj1 = Aig_ManCi( p->pAigWin, i );
        pObj2 = Aig_ManCi( p->pAigWin, k );
        Lits[0] = toLitCond( p->pCnf->pVarNums[pObj1->Id], 1 );
        Lits[1] = toLitCond( p->pCnf->pVarNums[pObj2->Id], 1 );
        if ( !sat_solver_addclause( p->pSat, Lits, Lits+2 ) )
        {
            sat_solver_delete( p->pSat );
            p->pSat = NULL;
            return 0;
        }
    }
    return 1;
}